

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

bool __thiscall
wallet::anon_unknown_5::WalletImpl::lockCoin(WalletImpl *this,COutPoint *output,bool write_to_db)

{
  _Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_> _Var1;
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> _Var2;
  bool bVar3;
  WalletBatch *batch;
  pointer *__ptr;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_device =
       &(((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        cs_wallet).super_recursive_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_40);
  if (write_to_db) {
    _Var1.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl =
         (((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->m_database)._M_t.
         super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
         ._M_t.
         super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
         .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>;
    if (_Var1.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl ==
        (WalletDatabase *)0x0) {
      __assert_fail("static_cast<bool>(m_database)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                    ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
    }
    batch = (WalletBatch *)operator_new(0x10);
    (*(*(_func_int ***)_Var1.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl)
      [0xe])(batch,_Var1.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl,1);
    batch->m_database =
         (WalletDatabase *)_Var1.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl
    ;
  }
  else {
    batch = (WalletBatch *)0x0;
  }
  bVar3 = CWallet::LockCoin((this->m_wallet).
                            super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            output,batch);
  if (batch != (WalletBatch *)0x0) {
    _Var2._M_head_impl =
         (batch->m_batch)._M_t.
         super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
         _M_t.
         super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
         .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
    if (_Var2._M_head_impl != (DatabaseBatch *)0x0) {
      (*(_Var2._M_head_impl)->_vptr_DatabaseBatch[5])();
    }
    (batch->m_batch)._M_t.
    super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t.
    super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
    super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl = (DatabaseBatch *)0x0;
    operator_delete(batch,0x10);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool lockCoin(const COutPoint& output, const bool write_to_db) override
    {
        LOCK(m_wallet->cs_wallet);
        std::unique_ptr<WalletBatch> batch = write_to_db ? std::make_unique<WalletBatch>(m_wallet->GetDatabase()) : nullptr;
        return m_wallet->LockCoin(output, batch.get());
    }